

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

CType google::protobuf::compiler::cpp::EffectiveStringCType(FieldDescriptor *field,Options *options)

{
  long in_RSI;
  FieldDescriptor *in_RDI;
  undefined4 local_4;
  
  if ((*(byte *)(in_RSI + 0x2c) & 1) == 0) {
    FieldDescriptor::options(in_RDI);
    local_4 = FieldOptions::ctype((FieldOptions *)0x435f7f);
  }
  else {
    local_4 = FieldOptions_CType_STRING;
  }
  return local_4;
}

Assistant:

FieldOptions::CType EffectiveStringCType(const FieldDescriptor* field,
                                         const Options& options) {
  GOOGLE_DCHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  if (options.opensource_runtime) {
    // Open-source protobuf release only supports STRING ctype.
    return FieldOptions::STRING;
  } else {
    // Google-internal supports all ctypes.
    return field->options().ctype();
  }
}